

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O2

void __thiscall QSynth::stopRecordingAudio(QSynth *this)

{
  QMutex *mutex;
  QMutexLocker<QMutex> synthLocker;
  QMutexLocker<QMutex> QStack_18;
  
  mutex = this->synthMutex;
  QMutexLocker<QMutex>::QMutexLocker(&QStack_18,mutex);
  if (this->audioRecorder != (AudioFileWriter *)0x0) {
    AudioFileWriter::close(this->audioRecorder,(int)mutex);
    if (this->audioRecorder != (AudioFileWriter *)0x0) {
      (*this->audioRecorder->_vptr_AudioFileWriter[1])();
    }
    this->audioRecorder = (AudioFileWriter *)0x0;
  }
  QMutexLocker<QMutex>::unlock(&QStack_18);
  return;
}

Assistant:

void QSynth::stopRecordingAudio() {
	QMutexLocker synthLocker(synthMutex);
	if (!isRecordingAudio()) return;
	audioRecorder->close();
	delete audioRecorder;
	audioRecorder = NULL;
}